

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_color.h
# Opt level: O0

void crnlib::color::YCC_to_RGB(color_quad_u8 *rgb,color_quad_u8 *ycc,int cb_bias,int cr_bias)

{
  byte bVar1;
  byte bVar2;
  uint8 uVar3;
  uint uVar4;
  int in_ECX;
  int in_EDX;
  byte *in_RSI;
  uint8 *in_RDI;
  int cr;
  int cb;
  int y;
  
  uVar4 = (uint)in_RSI[3];
  bVar1 = *in_RSI;
  bVar2 = in_RSI[1];
  uVar3 = clamp_component(uVar4 + ((int)(((uint)bVar2 - in_ECX) * 0x166e9 + 0x8000) >> 0x10));
  *in_RDI = uVar3;
  uVar3 = clamp_component(uVar4 + ((int)(((uint)bVar2 - in_ECX) * -0xb6d2 +
                                         ((uint)bVar1 - in_EDX) * -0x581a + 0x8000) >> 0x10));
  in_RDI[1] = uVar3;
  uVar3 = clamp_component(uVar4 + ((int)(((uint)bVar1 - in_EDX) * 0x1c5a2 + 0x8000) >> 0x10));
  in_RDI[2] = uVar3;
  in_RDI[3] = 0xff;
  return;
}

Assistant:

inline void YCC_to_RGB(color_quad_u8& rgb, const color_quad_u8& ycc, int cb_bias = 123, int cr_bias = 125) {
  const int y = ycc.a;
  const int cb = ycc.r - cb_bias;
  const int cr = ycc.g - cr_bias;
  rgb.r = clamp_component(y + ((R_CR * cr + 32768) >> 16));
  rgb.g = clamp_component(y + ((G_CR * cr + G_CB * cb + 32768) >> 16));
  rgb.b = clamp_component(y + ((B_CB * cb + 32768) >> 16));
  rgb.a = 255;
}